

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O3

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *weight_hr,Mat *hidden_state,Mat *cell_state,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint _h;
  void *pvVar8;
  size_t sVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  void *pvVar15;
  void *pvVar16;
  uint uVar17;
  float *pfVar18;
  ulong uVar19;
  ulong uVar20;
  float *pfVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  void *pvVar26;
  ulong uVar27;
  float *pfVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar36 [32];
  undefined1 auVar38 [64];
  float fVar46;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar64 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined4 uVar114;
  undefined1 in_ZMM12 [64];
  undefined1 auVar115 [16];
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  Mat local_158;
  undefined1 local_108 [16];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  long local_e8;
  ulong local_e0;
  ulong local_d8;
  Mat *local_d0;
  Mat *local_c8;
  ulong local_c0;
  long local_b8;
  void *local_b0;
  undefined1 local_a8 [32];
  Allocator *local_88;
  int iStack_80;
  int iStack_7c;
  undefined8 uStack_78;
  int local_70;
  size_t local_68;
  undefined1 local_58 [32];
  undefined1 auVar37 [32];
  
  uVar5 = bottom_blob->w;
  uVar6 = bottom_blob->h;
  uVar7 = top_blob->w;
  _h = cell_state->w;
  local_158.cstep = 0;
  local_158.data = (void *)0x0;
  local_158.refcount._0_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.elemsize = 0;
  local_158.elempack = 0;
  local_158.allocator = (Allocator *)0x0;
  local_158.dims = 0;
  local_158.w = 0;
  local_158.h = 0;
  local_158.d = 0;
  local_158.c = 0;
  local_c8 = top_blob;
  Mat::create(&local_158,4,_h,4,opt->workspace_allocator);
  iVar22 = -100;
  if ((local_158.data == (void *)0x0) || ((long)local_158.c * local_158.cstep == 0))
  goto LAB_0037cf06;
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_88 = (Allocator *)0x0;
  iStack_80 = 0;
  iStack_7c = 0;
  uStack_78._0_4_ = 0;
  uStack_78._4_4_ = 0;
  local_70 = 0;
  if (uVar7 == _h) {
LAB_0037c2f0:
    if (0 < (int)uVar6) {
      uVar19 = (ulong)(int)_h;
      local_d8 = uVar19 & 0xfffffffffffffffe;
      local_e0 = (ulong)(uint)((int)_h >> 2);
      uVar20 = uVar19 & 0xfffffffffffffffc;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = (ulong)_h - 1;
      auVar84 = vpshufd_avx(auVar84,0x44);
      local_58._16_16_ = auVar84;
      local_58._0_16_ = auVar84;
      local_e8 = local_e0 * 4;
      uVar27 = 0;
      local_d0 = weight_hc;
      do {
        uVar17 = ~(uint)uVar27 + uVar6;
        if (reverse == 0) {
          uVar17 = (uint)uVar27;
        }
        lVar25 = (long)(int)uVar17;
        if (0 < (int)_h >> 1) {
          uVar14 = 0;
          do {
            pfVar18 = (float *)((long)weight_xc->w * uVar14 * weight_xc->elemsize +
                               (long)weight_xc->data);
            pfVar21 = (float *)(bottom_blob->w * lVar25 * bottom_blob->elemsize +
                               (long)bottom_blob->data);
            pfVar28 = (float *)((long)bias_c->data + uVar14 * 0x20);
            fVar29 = *pfVar28;
            fVar39 = pfVar28[1];
            fVar40 = pfVar28[2];
            fVar41 = pfVar28[3];
            fVar42 = pfVar28[4];
            fVar43 = pfVar28[5];
            fVar44 = pfVar28[6];
            fVar45 = pfVar28[7];
            if ((int)uVar5 < 4) {
              fVar61 = 0.0;
              fVar65 = 0.0;
              fVar66 = 0.0;
              fVar67 = 0.0;
              fVar68 = 0.0;
              fVar69 = 0.0;
              fVar70 = 0.0;
              fVar71 = 0.0;
              auVar81 = ZEXT864(0);
              fVar46 = 0.0;
              fVar54 = 0.0;
              fVar55 = 0.0;
              fVar56 = 0.0;
              fVar57 = 0.0;
              fVar58 = 0.0;
              fVar59 = 0.0;
              fVar60 = 0.0;
              uVar17 = 0;
            }
            else {
              fVar46 = 0.0;
              fVar54 = 0.0;
              fVar55 = 0.0;
              fVar56 = 0.0;
              fVar57 = 0.0;
              fVar58 = 0.0;
              fVar59 = 0.0;
              fVar60 = 0.0;
              iVar22 = 3;
              auVar81 = ZEXT864(0);
              fVar61 = 0.0;
              fVar65 = 0.0;
              fVar66 = 0.0;
              fVar67 = 0.0;
              fVar68 = 0.0;
              fVar69 = 0.0;
              fVar70 = 0.0;
              fVar71 = 0.0;
              do {
                fVar1 = *pfVar21;
                fVar2 = pfVar21[1];
                fVar3 = pfVar21[2];
                fVar4 = pfVar21[3];
                fVar29 = fVar1 * *pfVar18 + fVar29;
                fVar39 = fVar1 * pfVar18[1] + fVar39;
                fVar40 = fVar1 * pfVar18[2] + fVar40;
                fVar41 = fVar1 * pfVar18[3] + fVar41;
                fVar42 = fVar1 * pfVar18[4] + fVar42;
                fVar43 = fVar1 * pfVar18[5] + fVar43;
                fVar44 = fVar1 * pfVar18[6] + fVar44;
                fVar45 = fVar1 + fVar45;
                fVar46 = fVar2 * pfVar18[8] + fVar46;
                fVar54 = fVar2 * pfVar18[9] + fVar54;
                fVar55 = fVar2 * pfVar18[10] + fVar55;
                fVar56 = fVar2 * pfVar18[0xb] + fVar56;
                fVar57 = fVar2 * pfVar18[0xc] + fVar57;
                fVar58 = fVar2 * pfVar18[0xd] + fVar58;
                fVar59 = fVar2 * pfVar18[0xe] + fVar59;
                fVar60 = fVar2 + fVar60;
                auVar81 = ZEXT3264(CONCAT428(fVar1 + auVar81._28_4_,
                                             CONCAT424(fVar3 * pfVar18[0x16] + auVar81._24_4_,
                                                       CONCAT420(fVar3 * pfVar18[0x15] +
                                                                 auVar81._20_4_,
                                                                 CONCAT416(fVar3 * pfVar18[0x14] +
                                                                           auVar81._16_4_,
                                                                           CONCAT412(fVar3 * pfVar18
                                                  [0x13] + auVar81._12_4_,
                                                  CONCAT48(fVar3 * pfVar18[0x12] + auVar81._8_4_,
                                                           CONCAT44(fVar3 * pfVar18[0x11] +
                                                                    auVar81._4_4_,
                                                                    fVar3 * pfVar18[0x10] +
                                                                    auVar81._0_4_))))))));
                fVar61 = fVar4 * pfVar18[0x18] + fVar61;
                fVar65 = fVar4 * pfVar18[0x19] + fVar65;
                fVar66 = fVar4 * pfVar18[0x1a] + fVar66;
                fVar67 = fVar4 * pfVar18[0x1b] + fVar67;
                fVar68 = fVar4 * pfVar18[0x1c] + fVar68;
                fVar69 = fVar4 * pfVar18[0x1d] + fVar69;
                fVar70 = fVar4 * pfVar18[0x1e] + fVar70;
                fVar71 = fVar1 + fVar71;
                pfVar21 = pfVar21 + 4;
                pfVar18 = pfVar18 + 0x20;
                iVar22 = iVar22 + 4;
                uVar17 = uVar5 & 0xfffffffc;
              } while (iVar22 < (int)uVar5);
            }
            auVar80 = auVar81._0_32_;
            if ((int)uVar17 < (int)uVar5) {
              lVar23 = 0;
              do {
                fVar1 = pfVar21[lVar23];
                fVar29 = fVar1 * *pfVar18 + fVar29;
                fVar39 = fVar1 * pfVar18[1] + fVar39;
                fVar40 = fVar1 * pfVar18[2] + fVar40;
                fVar41 = fVar1 * pfVar18[3] + fVar41;
                fVar42 = fVar1 * pfVar18[4] + fVar42;
                fVar43 = fVar1 * pfVar18[5] + fVar43;
                fVar44 = fVar1 * pfVar18[6] + fVar44;
                fVar45 = fVar1 + fVar45;
                pfVar18 = pfVar18 + 8;
                lVar23 = lVar23 + 1;
              } while (uVar5 - uVar17 != (int)lVar23);
            }
            pfVar18 = (float *)((long)local_d0->w * uVar14 * local_d0->elemsize +
                               (long)local_d0->data);
            pfVar28 = (float *)hidden_state->data;
            uVar17 = 0;
            if (3 < (int)uVar7) {
              iVar22 = 3;
              do {
                fVar1 = *pfVar28;
                fVar2 = pfVar28[1];
                fVar3 = pfVar28[2];
                fVar4 = pfVar28[3];
                fVar29 = fVar1 * *pfVar18 + fVar29;
                fVar39 = fVar1 * pfVar18[1] + fVar39;
                fVar40 = fVar1 * pfVar18[2] + fVar40;
                fVar41 = fVar1 * pfVar18[3] + fVar41;
                fVar42 = fVar1 * pfVar18[4] + fVar42;
                fVar43 = fVar1 * pfVar18[5] + fVar43;
                fVar44 = fVar1 * pfVar18[6] + fVar44;
                fVar45 = fVar1 + fVar45;
                fVar46 = fVar2 * pfVar18[8] + fVar46;
                fVar54 = fVar2 * pfVar18[9] + fVar54;
                fVar55 = fVar2 * pfVar18[10] + fVar55;
                fVar56 = fVar2 * pfVar18[0xb] + fVar56;
                fVar57 = fVar2 * pfVar18[0xc] + fVar57;
                fVar58 = fVar2 * pfVar18[0xd] + fVar58;
                fVar59 = fVar2 * pfVar18[0xe] + fVar59;
                fVar60 = fVar2 + fVar60;
                auVar80._0_4_ = fVar3 * pfVar18[0x10] + auVar81._0_4_;
                auVar80._4_4_ = fVar3 * pfVar18[0x11] + auVar81._4_4_;
                auVar80._8_4_ = fVar3 * pfVar18[0x12] + auVar81._8_4_;
                auVar80._12_4_ = fVar3 * pfVar18[0x13] + auVar81._12_4_;
                auVar80._16_4_ = fVar3 * pfVar18[0x14] + auVar81._16_4_;
                auVar80._20_4_ = fVar3 * pfVar18[0x15] + auVar81._20_4_;
                auVar80._24_4_ = fVar3 * pfVar18[0x16] + auVar81._24_4_;
                auVar80._28_4_ = fVar1 + auVar81._28_4_;
                auVar81 = ZEXT3264(auVar80);
                fVar61 = fVar4 * pfVar18[0x18] + fVar61;
                fVar65 = fVar4 * pfVar18[0x19] + fVar65;
                fVar66 = fVar4 * pfVar18[0x1a] + fVar66;
                fVar67 = fVar4 * pfVar18[0x1b] + fVar67;
                fVar68 = fVar4 * pfVar18[0x1c] + fVar68;
                fVar69 = fVar4 * pfVar18[0x1d] + fVar69;
                fVar70 = fVar4 * pfVar18[0x1e] + fVar70;
                fVar71 = fVar1 + fVar71;
                pfVar28 = pfVar28 + 4;
                pfVar18 = pfVar18 + 0x20;
                iVar22 = iVar22 + 4;
                uVar17 = uVar7 & 0xfffffffc;
              } while (iVar22 < (int)uVar7);
            }
            if ((int)uVar17 < (int)uVar7) {
              lVar23 = 0;
              do {
                fVar1 = pfVar28[lVar23];
                fVar29 = fVar1 * *pfVar18 + fVar29;
                fVar39 = fVar1 * pfVar18[1] + fVar39;
                fVar40 = fVar1 * pfVar18[2] + fVar40;
                fVar41 = fVar1 * pfVar18[3] + fVar41;
                fVar42 = fVar1 * pfVar18[4] + fVar42;
                fVar43 = fVar1 * pfVar18[5] + fVar43;
                fVar44 = fVar1 * pfVar18[6] + fVar44;
                fVar45 = fVar1 + fVar45;
                pfVar18 = pfVar18 + 8;
                lVar23 = lVar23 + 1;
              } while (uVar7 - uVar17 != (int)lVar23);
            }
            auVar36._0_4_ = auVar80._0_4_ + fVar61 + fVar46 + fVar29;
            auVar36._4_4_ = auVar80._4_4_ + fVar65 + fVar54 + fVar39;
            auVar36._8_4_ = auVar80._8_4_ + fVar66 + fVar55 + fVar40;
            auVar36._12_4_ = auVar80._12_4_ + fVar67 + fVar56 + fVar41;
            auVar36._16_4_ = auVar80._16_4_ + fVar68 + fVar57 + fVar42;
            auVar36._20_4_ = auVar80._20_4_ + fVar69 + fVar58 + fVar43;
            auVar36._24_4_ = auVar80._24_4_ + fVar70 + fVar59 + fVar44;
            auVar36._28_4_ = auVar80._28_4_ + fVar71 + fVar60 + fVar45;
            *(undefined1 (*) [32])
             ((long)local_158.data + (long)local_158.w * uVar14 * 2 * local_158.elemsize) = auVar36;
            uVar14 = uVar14 + 1;
          } while (uVar14 != (uint)((int)_h >> 1));
        }
        uVar14 = local_d8;
        if ((uint)local_d8 != _h) {
          do {
            uVar17 = ((uint)(uVar14 >> 0x1f) & 1) + (int)uVar14;
            lVar23 = (long)(int)(((int)uVar17 >> 1) + ((int)uVar14 - (uVar17 & 0xfffffffe)));
            pfVar18 = (float *)(weight_xc->w * lVar23 * weight_xc->elemsize + (long)weight_xc->data)
            ;
            pfVar21 = (float *)(bottom_blob->w * lVar25 * bottom_blob->elemsize +
                               (long)bottom_blob->data);
            pfVar28 = (float *)((long)bias_c->data + uVar14 * 0x10);
            fVar29 = *pfVar28;
            fVar39 = pfVar28[1];
            fVar40 = pfVar28[2];
            fVar41 = pfVar28[3];
            if ((int)uVar5 < 4) {
              fVar46 = 0.0;
              fVar54 = 0.0;
              fVar55 = 0.0;
              fVar56 = 0.0;
              auVar81 = ZEXT864(0);
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              fVar45 = 0.0;
              uVar17 = 0;
            }
            else {
              fVar42 = 0.0;
              fVar43 = 0.0;
              fVar44 = 0.0;
              fVar45 = 0.0;
              iVar22 = 3;
              auVar81 = ZEXT864(0);
              fVar46 = 0.0;
              fVar54 = 0.0;
              fVar55 = 0.0;
              fVar56 = 0.0;
              do {
                fVar57 = *pfVar21;
                fVar58 = pfVar21[1];
                fVar59 = pfVar21[2];
                fVar60 = pfVar21[3];
                fVar29 = fVar57 * *pfVar18 + fVar29;
                fVar39 = fVar57 * pfVar18[1] + fVar39;
                fVar40 = fVar57 * pfVar18[2] + fVar40;
                fVar41 = fVar57 * pfVar18[3] + fVar41;
                fVar46 = fVar58 * pfVar18[4] + fVar46;
                fVar54 = fVar58 * pfVar18[5] + fVar54;
                fVar55 = fVar58 * pfVar18[6] + fVar55;
                fVar56 = fVar58 * pfVar18[7] + fVar56;
                auVar81 = ZEXT1664(CONCAT412(fVar59 * pfVar18[0xb] + auVar81._12_4_,
                                             CONCAT48(fVar59 * pfVar18[10] + auVar81._8_4_,
                                                      CONCAT44(fVar59 * pfVar18[9] + auVar81._4_4_,
                                                               fVar59 * pfVar18[8] + auVar81._0_4_))
                                            ));
                fVar42 = fVar60 * pfVar18[0xc] + fVar42;
                fVar43 = fVar60 * pfVar18[0xd] + fVar43;
                fVar44 = fVar60 * pfVar18[0xe] + fVar44;
                fVar45 = fVar60 * pfVar18[0xf] + fVar45;
                pfVar21 = pfVar21 + 4;
                pfVar18 = pfVar18 + 0x10;
                iVar22 = iVar22 + 4;
                uVar17 = uVar5 & 0xfffffffc;
              } while (iVar22 < (int)uVar5);
            }
            auVar72 = auVar81._0_16_;
            if ((int)uVar17 < (int)uVar5) {
              lVar24 = 0;
              do {
                fVar57 = pfVar21[lVar24];
                fVar29 = fVar57 * *pfVar18 + fVar29;
                fVar39 = fVar57 * pfVar18[1] + fVar39;
                fVar40 = fVar57 * pfVar18[2] + fVar40;
                fVar41 = fVar57 * pfVar18[3] + fVar41;
                pfVar18 = pfVar18 + 4;
                lVar24 = lVar24 + 1;
              } while (uVar5 - uVar17 != (int)lVar24);
            }
            pfVar18 = (float *)(local_d0->w * lVar23 * local_d0->elemsize + (long)local_d0->data);
            pfVar28 = (float *)hidden_state->data;
            uVar17 = 0;
            if (3 < (int)uVar7) {
              iVar22 = 3;
              do {
                fVar57 = *pfVar28;
                fVar58 = pfVar28[1];
                fVar59 = pfVar28[2];
                fVar60 = pfVar28[3];
                fVar29 = fVar57 * *pfVar18 + fVar29;
                fVar39 = fVar57 * pfVar18[1] + fVar39;
                fVar40 = fVar57 * pfVar18[2] + fVar40;
                fVar41 = fVar57 * pfVar18[3] + fVar41;
                fVar46 = fVar58 * pfVar18[4] + fVar46;
                fVar54 = fVar58 * pfVar18[5] + fVar54;
                fVar55 = fVar58 * pfVar18[6] + fVar55;
                fVar56 = fVar58 * pfVar18[7] + fVar56;
                auVar72._0_4_ = fVar59 * pfVar18[8] + auVar81._0_4_;
                auVar72._4_4_ = fVar59 * pfVar18[9] + auVar81._4_4_;
                auVar72._8_4_ = fVar59 * pfVar18[10] + auVar81._8_4_;
                auVar72._12_4_ = fVar59 * pfVar18[0xb] + auVar81._12_4_;
                auVar81 = ZEXT1664(auVar72);
                fVar42 = fVar60 * pfVar18[0xc] + fVar42;
                fVar43 = fVar60 * pfVar18[0xd] + fVar43;
                fVar44 = fVar60 * pfVar18[0xe] + fVar44;
                fVar45 = fVar60 * pfVar18[0xf] + fVar45;
                pfVar28 = pfVar28 + 4;
                pfVar18 = pfVar18 + 0x10;
                iVar22 = iVar22 + 4;
                uVar17 = uVar7 & 0xfffffffc;
              } while (iVar22 < (int)uVar7);
            }
            if ((int)uVar17 < (int)uVar7) {
              lVar23 = 0;
              do {
                fVar57 = pfVar28[lVar23];
                fVar29 = fVar57 * *pfVar18 + fVar29;
                fVar39 = fVar57 * pfVar18[1] + fVar39;
                fVar40 = fVar57 * pfVar18[2] + fVar40;
                fVar41 = fVar57 * pfVar18[3] + fVar41;
                pfVar18 = pfVar18 + 4;
                lVar23 = lVar23 + 1;
              } while (uVar7 - uVar17 != (int)lVar23);
            }
            auVar30._0_4_ = auVar72._0_4_ + fVar46 + fVar42 + fVar29;
            auVar30._4_4_ = auVar72._4_4_ + fVar54 + fVar43 + fVar39;
            auVar30._8_4_ = auVar72._8_4_ + fVar55 + fVar44 + fVar40;
            auVar30._12_4_ = auVar72._12_4_ + fVar56 + fVar45 + fVar41;
            *(undefined1 (*) [16])
             ((long)local_158.data + (long)local_158.w * uVar14 * local_158.elemsize) = auVar30;
            uVar14 = uVar14 + 1;
          } while ((long)uVar14 < (long)uVar19);
        }
        pvVar26 = (void *)(lVar25 * local_c8->w * local_c8->elemsize + (long)local_c8->data);
        pvVar16 = cell_state->data;
        pvVar8 = hidden_state->data;
        if (0 < (int)local_e0) {
          lVar25 = 0;
          do {
            lVar23 = local_158.w * lVar25 * local_158.elemsize;
            auVar84 = *(undefined1 (*) [16])((long)local_158.data + lVar23 + 0x10);
            auVar72 = *(undefined1 (*) [16])((long)local_158.data + lVar23 + 0x20);
            auVar30 = *(undefined1 (*) [16])((long)local_158.data + lVar23 + 0x30);
            auVar50 = vunpcklps_avx(*(undefined1 (*) [16])((long)local_158.data + lVar23),auVar84);
            auVar32 = vunpcklps_avx(auVar72,auVar30);
            auVar31 = vunpckhps_avx(*(undefined1 (*) [16])((long)local_158.data + lVar23),auVar84);
            auVar72 = vunpckhps_avx(auVar72,auVar30);
            auVar84 = vmovlhps_avx(auVar50,auVar32);
            auVar32 = vunpckhpd_avx(auVar50,auVar32);
            auVar50 = vmovlhps_avx(auVar31,auVar72);
            auVar31 = vunpckhpd_avx(auVar31,auVar72);
            auVar47._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
            auVar47._8_4_ = auVar84._8_4_ ^ 0x80000000;
            auVar47._12_4_ = auVar84._12_4_ ^ 0x80000000;
            auVar115._8_4_ = 0x42b0c0a5;
            auVar115._0_8_ = 0x42b0c0a542b0c0a5;
            auVar115._12_4_ = 0x42b0c0a5;
            auVar84 = vminps_avx(auVar115,auVar47);
            auVar111._8_4_ = 0xc2b0c0a5;
            auVar111._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar111._12_4_ = 0xc2b0c0a5;
            auVar30 = vmaxps_avx(auVar111,auVar84);
            auVar82._0_4_ = auVar30._0_4_ * 1.442695 + 0.5;
            auVar82._4_4_ = auVar30._4_4_ * 1.442695 + 0.5;
            auVar82._8_4_ = auVar30._8_4_ * 1.442695 + 0.5;
            auVar82._12_4_ = auVar30._12_4_ * 1.442695 + 0.5;
            auVar95._0_4_ = (int)auVar82._0_4_;
            auVar95._4_4_ = (int)auVar82._4_4_;
            auVar95._8_4_ = (int)auVar82._8_4_;
            auVar95._12_4_ = (int)auVar82._12_4_;
            auVar72 = vcvtdq2ps_avx(auVar95);
            auVar84 = vcmpps_avx(auVar82,auVar72,1);
            auVar112._8_4_ = 0x3f800000;
            auVar112._0_8_ = 0x3f8000003f800000;
            auVar112._12_4_ = 0x3f800000;
            auVar84 = vandps_avx(auVar112,auVar84);
            auVar84 = vsubps_avx(auVar72,auVar84);
            auVar96._0_4_ = auVar84._0_4_ * 0.6931472;
            auVar96._4_4_ = auVar84._4_4_ * 0.6931472;
            auVar96._8_4_ = auVar84._8_4_ * 0.6931472;
            auVar96._12_4_ = auVar84._12_4_ * 0.6931472;
            auVar72 = vsubps_avx(auVar30,auVar96);
            fVar29 = auVar72._0_4_;
            fVar39 = auVar72._4_4_;
            fVar40 = auVar72._8_4_;
            fVar41 = auVar72._12_4_;
            auVar83._0_4_ = (int)auVar84._0_4_;
            auVar83._4_4_ = (int)auVar84._4_4_;
            auVar83._8_4_ = (int)auVar84._8_4_;
            auVar83._12_4_ = (int)auVar84._12_4_;
            auVar84 = vpslld_avx(auVar83,0x17);
            auVar84 = vpaddd_avx(auVar112,auVar84);
            local_f8 = (fVar29 + 1.0 +
                       fVar29 * fVar29 *
                       (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29
                         + 0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar84._0_4_;
            fStack_f4 = (fVar39 + 1.0 +
                        fVar39 * fVar39 *
                        (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39
                          + 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar84._4_4_;
            fStack_f0 = (fVar40 + 1.0 +
                        fVar40 * fVar40 *
                        (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40
                          + 0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar84._8_4_;
            fStack_ec = (fVar41 + 1.0 +
                        fVar41 * fVar41 *
                        (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41
                          + 0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar84._12_4_;
            auVar73._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
            auVar73._8_4_ = auVar32._8_4_ ^ 0x80000000;
            auVar73._12_4_ = auVar32._12_4_ ^ 0x80000000;
            auVar84 = vminps_avx(auVar115,auVar73);
            auVar30 = vmaxps_avx(auVar111,auVar84);
            auVar85._0_4_ = auVar30._0_4_ * 1.442695 + 0.5;
            auVar85._4_4_ = auVar30._4_4_ * 1.442695 + 0.5;
            auVar85._8_4_ = auVar30._8_4_ * 1.442695 + 0.5;
            auVar85._12_4_ = auVar30._12_4_ * 1.442695 + 0.5;
            auVar97._0_4_ = (int)auVar85._0_4_;
            auVar97._4_4_ = (int)auVar85._4_4_;
            auVar97._8_4_ = (int)auVar85._8_4_;
            auVar97._12_4_ = (int)auVar85._12_4_;
            auVar72 = vcvtdq2ps_avx(auVar97);
            auVar84 = vcmpps_avx(auVar85,auVar72,1);
            auVar84 = vandps_avx(auVar112,auVar84);
            auVar84 = vsubps_avx(auVar72,auVar84);
            auVar98._0_4_ = auVar84._0_4_ * 0.6931472;
            auVar98._4_4_ = auVar84._4_4_ * 0.6931472;
            auVar98._8_4_ = auVar84._8_4_ * 0.6931472;
            auVar98._12_4_ = auVar84._12_4_ * 0.6931472;
            auVar72 = vsubps_avx(auVar30,auVar98);
            fVar29 = auVar72._0_4_;
            fVar41 = auVar72._4_4_;
            fVar44 = auVar72._8_4_;
            fVar54 = auVar72._12_4_;
            auVar86._0_4_ = (int)auVar84._0_4_;
            auVar86._4_4_ = (int)auVar84._4_4_;
            auVar86._8_4_ = (int)auVar84._8_4_;
            auVar86._12_4_ = (int)auVar84._12_4_;
            auVar84 = vpslld_avx(auVar86,0x17);
            auVar32 = vpaddd_avx(auVar112,auVar84);
            auVar62._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
            auVar62._8_4_ = auVar50._8_4_ ^ 0x80000000;
            auVar62._12_4_ = auVar50._12_4_ ^ 0x80000000;
            auVar84 = vminps_avx(auVar115,auVar62);
            auVar74._8_4_ = 0xc2b0c0a5;
            auVar74._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar74._12_4_ = 0xc2b0c0a5;
            auVar30 = vmaxps_avx(auVar84,auVar74);
            auVar87._0_4_ = auVar30._0_4_ * 1.442695 + 0.5;
            auVar87._4_4_ = auVar30._4_4_ * 1.442695 + 0.5;
            auVar87._8_4_ = auVar30._8_4_ * 1.442695 + 0.5;
            auVar87._12_4_ = auVar30._12_4_ * 1.442695 + 0.5;
            auVar99._0_4_ = (int)auVar87._0_4_;
            auVar99._4_4_ = (int)auVar87._4_4_;
            auVar99._8_4_ = (int)auVar87._8_4_;
            auVar99._12_4_ = (int)auVar87._12_4_;
            auVar72 = vcvtdq2ps_avx(auVar99);
            auVar84 = vcmpps_avx(auVar87,auVar72,1);
            auVar84 = vandps_avx(auVar112,auVar84);
            auVar84 = vsubps_avx(auVar72,auVar84);
            auVar100._0_4_ = auVar84._0_4_ * 0.6931472;
            auVar100._4_4_ = auVar84._4_4_ * 0.6931472;
            auVar100._8_4_ = auVar84._8_4_ * 0.6931472;
            auVar100._12_4_ = auVar84._12_4_ * 0.6931472;
            in_ZMM12 = ZEXT1664(CONCAT412(0x3f317218,CONCAT48(0x3f317218,0x3f3172183f317218)));
            auVar72 = vsubps_avx(auVar30,auVar100);
            fVar39 = auVar72._0_4_;
            fVar42 = auVar72._4_4_;
            fVar45 = auVar72._8_4_;
            fVar55 = auVar72._12_4_;
            auVar88._0_4_ = (int)auVar84._0_4_;
            auVar88._4_4_ = (int)auVar84._4_4_;
            auVar88._8_4_ = (int)auVar84._8_4_;
            auVar88._12_4_ = (int)auVar84._12_4_;
            auVar84 = vpslld_avx(auVar88,0x17);
            auVar50 = vpaddd_avx(auVar112,auVar84);
            local_198 = auVar31._0_4_;
            fStack_194 = auVar31._4_4_;
            fStack_190 = auVar31._8_4_;
            fStack_18c = auVar31._12_4_;
            auVar31._0_4_ = local_198 * -2.0;
            auVar31._4_4_ = fStack_194 * -2.0;
            auVar31._8_4_ = fStack_190 * -2.0;
            auVar31._12_4_ = fStack_18c * -2.0;
            auVar84 = vminps_avx(auVar115,auVar31);
            auVar30 = vmaxps_avx(auVar84,auVar74);
            auVar89._0_4_ = auVar30._0_4_ * 1.442695 + 0.5;
            auVar89._4_4_ = auVar30._4_4_ * 1.442695 + 0.5;
            auVar89._8_4_ = auVar30._8_4_ * 1.442695 + 0.5;
            auVar89._12_4_ = auVar30._12_4_ * 1.442695 + 0.5;
            auVar101._0_4_ = (int)auVar89._0_4_;
            auVar101._4_4_ = (int)auVar89._4_4_;
            auVar101._8_4_ = (int)auVar89._8_4_;
            auVar101._12_4_ = (int)auVar89._12_4_;
            auVar72 = vcvtdq2ps_avx(auVar101);
            auVar84 = vcmpps_avx(auVar89,auVar72,1);
            auVar84 = vandps_avx(auVar112,auVar84);
            auVar84 = vsubps_avx(auVar72,auVar84);
            auVar102._0_4_ = auVar84._0_4_ * 0.6931472;
            auVar102._4_4_ = auVar84._4_4_ * 0.6931472;
            auVar102._8_4_ = auVar84._8_4_ * 0.6931472;
            auVar102._12_4_ = auVar84._12_4_ * 0.6931472;
            auVar72 = vsubps_avx(auVar30,auVar102);
            fVar40 = auVar72._0_4_;
            fVar43 = auVar72._4_4_;
            fVar46 = auVar72._8_4_;
            fVar56 = auVar72._12_4_;
            auVar48._0_4_ = local_f8 + 1.0;
            auVar48._4_4_ = fStack_f4 + 1.0;
            auVar48._8_4_ = fStack_f0 + 1.0;
            auVar48._12_4_ = fStack_ec + 1.0;
            auVar75._0_4_ =
                 (fVar29 + 1.0 +
                 fVar29 * fVar29 *
                 (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
                   0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar32._0_4_ + 1.0;
            auVar75._4_4_ =
                 (fVar41 + 1.0 +
                 fVar41 * fVar41 *
                 (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                   0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar32._4_4_ + 1.0;
            auVar75._8_4_ =
                 (fVar44 + 1.0 +
                 fVar44 * fVar44 *
                 (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                   0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5)) * auVar32._8_4_ + 1.0;
            auVar75._12_4_ =
                 (fVar54 + 1.0 +
                 fVar54 * fVar54 *
                 (((((fVar54 * 0.00019875691 + 0.0013981999) * fVar54 + 0.008333452) * fVar54 +
                   0.041665796) * fVar54 + 0.16666666) * fVar54 + 0.5)) * auVar32._12_4_ + 1.0;
            auVar90._0_4_ = (int)auVar84._0_4_;
            auVar90._4_4_ = (int)auVar84._4_4_;
            auVar90._8_4_ = (int)auVar84._8_4_;
            auVar90._12_4_ = (int)auVar84._12_4_;
            auVar84 = vpslld_avx(auVar90,0x17);
            auVar84 = vpaddd_avx(auVar112,auVar84);
            auVar32._0_4_ =
                 (fVar40 + 1.0 +
                 fVar40 * fVar40 *
                 (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                   0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar84._0_4_ + 1.0;
            auVar32._4_4_ =
                 (fVar43 + 1.0 +
                 fVar43 * fVar43 *
                 (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                   0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar84._4_4_ + 1.0;
            auVar32._8_4_ =
                 (fVar46 + 1.0 +
                 fVar46 * fVar46 *
                 (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                   0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5)) * auVar84._8_4_ + 1.0;
            auVar32._12_4_ =
                 (fVar56 + 1.0 +
                 fVar56 * fVar56 *
                 (((((fVar56 * 0.00019875691 + 0.0013981999) * fVar56 + 0.008333452) * fVar56 +
                   0.041665796) * fVar56 + 0.16666666) * fVar56 + 0.5)) * auVar84._12_4_ + 1.0;
            auVar104._8_4_ = 0x40000000;
            auVar104._0_8_ = 0x4000000040000000;
            auVar104._12_4_ = 0x40000000;
            auVar84 = vdivps_avx(auVar104,auVar32);
            auVar33._0_4_ = auVar84._0_4_ + -1.0;
            auVar33._4_4_ = auVar84._4_4_ + -1.0;
            auVar33._8_4_ = auVar84._8_4_ + -1.0;
            auVar33._12_4_ = auVar84._12_4_ + -1.0;
            auVar84 = vdivps_avx(auVar33,auVar48);
            auVar72 = vdivps_avx(*(undefined1 (*) [16])((long)pvVar16 + lVar25 * 4),auVar75);
            auVar34._0_4_ = auVar84._0_4_ + auVar72._0_4_;
            auVar34._4_4_ = auVar84._4_4_ + auVar72._4_4_;
            auVar34._8_4_ = auVar84._8_4_ + auVar72._8_4_;
            auVar34._12_4_ = auVar84._12_4_ + auVar72._12_4_;
            auVar49._0_4_ = auVar34._0_4_ * -2.0;
            auVar49._4_4_ = auVar34._4_4_ * -2.0;
            auVar49._8_4_ = auVar34._8_4_ * -2.0;
            auVar49._12_4_ = auVar34._12_4_ * -2.0;
            auVar84 = vminps_avx(auVar115,auVar49);
            auVar76._8_4_ = 0xc2b0c0a5;
            auVar76._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar76._12_4_ = 0xc2b0c0a5;
            auVar30 = vmaxps_avx(auVar84,auVar76);
            auVar77._0_4_ = auVar30._0_4_ * 1.442695 + 0.5;
            auVar77._4_4_ = auVar30._4_4_ * 1.442695 + 0.5;
            auVar77._8_4_ = auVar30._8_4_ * 1.442695 + 0.5;
            auVar77._12_4_ = auVar30._12_4_ * 1.442695 + 0.5;
            auVar91._0_4_ = (int)auVar77._0_4_;
            auVar91._4_4_ = (int)auVar77._4_4_;
            auVar91._8_4_ = (int)auVar77._8_4_;
            auVar91._12_4_ = (int)auVar77._12_4_;
            auVar72 = vcvtdq2ps_avx(auVar91);
            auVar84 = vcmpps_avx(auVar77,auVar72,1);
            auVar84 = vandps_avx(auVar112,auVar84);
            auVar84 = vsubps_avx(auVar72,auVar84);
            auVar92._0_4_ = auVar84._0_4_ * 0.6931472;
            auVar92._4_4_ = auVar84._4_4_ * 0.6931472;
            auVar92._8_4_ = auVar84._8_4_ * 0.6931472;
            auVar92._12_4_ = auVar84._12_4_ * 0.6931472;
            auVar72 = vsubps_avx(auVar30,auVar92);
            fVar29 = auVar72._0_4_;
            fVar40 = auVar72._4_4_;
            fVar41 = auVar72._8_4_;
            fVar43 = auVar72._12_4_;
            auVar78._0_4_ = (int)auVar84._0_4_;
            auVar78._4_4_ = (int)auVar84._4_4_;
            auVar78._8_4_ = (int)auVar84._8_4_;
            auVar78._12_4_ = (int)auVar84._12_4_;
            auVar84 = vpslld_avx(auVar78,0x17);
            auVar84 = vpaddd_avx(auVar112,auVar84);
            auVar63._0_4_ =
                 (fVar39 + 1.0 +
                 fVar39 * fVar39 *
                 (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
                   0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar50._0_4_ + 1.0;
            auVar63._4_4_ =
                 (fVar42 + 1.0 +
                 fVar42 * fVar42 *
                 (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
                   0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5)) * auVar50._4_4_ + 1.0;
            auVar63._8_4_ =
                 (fVar45 + 1.0 +
                 fVar45 * fVar45 *
                 (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                   0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5)) * auVar50._8_4_ + 1.0;
            auVar63._12_4_ =
                 (fVar55 + 1.0 +
                 fVar55 * fVar55 *
                 (((((fVar55 * 0.00019875691 + 0.0013981999) * fVar55 + 0.008333452) * fVar55 +
                   0.041665796) * fVar55 + 0.16666666) * fVar55 + 0.5)) * auVar50._12_4_ + 1.0;
            auVar50._0_4_ =
                 (fVar29 + 1.0 +
                 fVar29 * fVar29 *
                 (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
                   0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5)) * auVar84._0_4_ + 1.0;
            auVar50._4_4_ =
                 (fVar40 + 1.0 +
                 fVar40 * fVar40 *
                 (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) * fVar40 +
                   0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5)) * auVar84._4_4_ + 1.0;
            auVar50._8_4_ =
                 (fVar41 + 1.0 +
                 fVar41 * fVar41 *
                 (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) * fVar41 +
                   0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5)) * auVar84._8_4_ + 1.0;
            auVar50._12_4_ =
                 (fVar43 + 1.0 +
                 fVar43 * fVar43 *
                 (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                   0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5)) * auVar84._12_4_ + 1.0;
            auVar84 = vdivps_avx(auVar104,auVar50);
            auVar51._0_4_ = auVar84._0_4_ + -1.0;
            auVar51._4_4_ = auVar84._4_4_ + -1.0;
            auVar51._8_4_ = auVar84._8_4_ + -1.0;
            auVar51._12_4_ = auVar84._12_4_ + -1.0;
            auVar84 = vdivps_avx(auVar51,auVar63);
            *(undefined1 (*) [16])((long)pvVar16 + lVar25 * 4) = auVar34;
            pvVar15 = (void *)local_a8._0_8_;
            if (uVar7 == _h) {
              *(undefined1 (*) [16])((long)pvVar8 + lVar25 * 4) = auVar84;
              pvVar15 = pvVar26;
            }
            *(undefined1 (*) [16])((long)pvVar15 + lVar25 * 4) = auVar84;
            lVar25 = lVar25 + 4;
          } while (local_e8 != lVar25);
        }
        auVar84 = in_ZMM12._0_16_;
        local_b0 = (void *)local_a8._0_8_;
        local_c0 = uVar27;
        if ((uint)uVar20 != _h) {
          local_b8 = (long)local_158.w * local_158.elemsize;
          pfVar28 = (float *)((long)local_158.data + local_b8 * uVar20 + 0xc);
          uVar27 = uVar20;
          do {
            fVar29 = *pfVar28;
            local_108 = ZEXT416((uint)pfVar28[-2]);
            fVar39 = pfVar28[-1];
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            local_f8 = expf(-pfVar28[-3]);
            local_f8 = local_f8 + 1.0;
            fVar40 = expf(-(float)local_108._0_4_);
            local_108._0_4_ = fVar40 + 1.0;
            fVar39 = expf(-fVar39);
            fVar29 = tanhf(fVar29);
            fVar29 = *(float *)((long)pvVar16 + uVar27 * 4) / (float)local_108._0_4_ +
                     fVar29 / local_f8;
            fVar40 = tanhf(fVar29);
            auVar84 = in_ZMM12._0_16_;
            fVar40 = fVar40 / (fVar39 + 1.0);
            *(float *)((long)pvVar16 + uVar27 * 4) = fVar29;
            pvVar15 = local_b0;
            if (uVar7 == _h) {
              *(float *)((long)pvVar8 + uVar27 * 4) = fVar40;
              pvVar15 = pvVar26;
            }
            *(float *)((long)pvVar15 + uVar27 * 4) = fVar40;
            uVar27 = uVar27 + 1;
            pfVar28 = (float *)((long)pfVar28 + local_b8);
          } while ((long)uVar27 < (long)uVar19);
        }
        auVar36 = _DAT_005a48a0;
        auVar80 = _DAT_005a4880;
        auVar84 = vpcmpeqd_avx(auVar84,auVar84);
        in_ZMM12 = ZEXT1664(auVar84);
        if (0 < (int)uVar7 && uVar7 != _h) {
          pvVar16 = weight_hr->data;
          iVar22 = weight_hr->w;
          sVar9 = weight_hr->elemsize;
          uVar27 = 0;
          do {
            if ((int)_h < 1) {
              uVar114 = 0;
            }
            else {
              uVar14 = 0;
              auVar81 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar38 = auVar81;
                auVar52._8_8_ = 0;
                auVar52._0_8_ = uVar14;
                auVar72 = vpshufd_avx(auVar52,0x44);
                auVar64._16_16_ = auVar72;
                auVar64._0_16_ = auVar72;
                auVar10 = vorps_avx(auVar80,auVar64);
                auVar64 = vorps_avx(auVar36,auVar64);
                auVar103._0_8_ = local_58._16_8_ ^ 0x8000000000000000;
                auVar103._8_4_ = local_58._24_4_;
                auVar103._12_4_ = local_58._28_4_ ^ 0x80000000;
                auVar93._0_8_ = auVar64._16_8_ ^ 0x8000000000000000;
                auVar93._8_4_ = auVar64._24_4_;
                auVar93._12_4_ = auVar64._28_4_ ^ 0x80000000;
                auVar50 = vpcmpgtq_avx(auVar93,auVar103);
                uVar12 = local_58._0_8_;
                auVar105._0_8_ = uVar12 ^ 0x8000000000000000;
                uVar114 = local_58._8_4_;
                auVar105._8_4_ = uVar114;
                uVar17 = local_58._12_4_;
                auVar105._12_4_ = uVar17 ^ 0x80000000;
                auVar106._0_8_ = auVar64._0_8_ ^ 0x8000000000000000;
                auVar79._8_4_ = auVar64._8_4_;
                auVar106._8_4_ = auVar79._8_4_;
                auVar106._12_4_ = auVar64._12_4_ ^ 0x80000000;
                auVar72 = vpcmpgtq_avx(auVar106,auVar105);
                auVar72 = vpackssdw_avx(auVar72,auVar50);
                auVar107._0_8_ = auVar10._16_8_ ^ 0x8000000000000000;
                auVar107._8_4_ = auVar10._24_4_;
                auVar107._12_4_ = auVar10._28_4_ ^ 0x80000000;
                auVar32 = vpcmpgtq_avx(auVar107,auVar103);
                auVar108._0_8_ = uVar12 ^ 0x8000000000000000;
                auVar108._8_4_ = uVar114;
                auVar108._12_4_ = uVar17 ^ 0x80000000;
                auVar113._0_8_ = auVar10._0_8_ ^ 0x8000000000000000;
                auVar53._8_4_ = auVar10._8_4_;
                auVar113._8_4_ = auVar53._8_4_;
                auVar113._12_4_ = auVar10._12_4_ ^ 0x80000000;
                auVar30 = vpcmpgtq_avx(auVar113,auVar108);
                auVar30 = vpackssdw_avx(auVar30,auVar32);
                auVar72 = vpackssdw_avx(auVar84 ^ auVar30,auVar84 ^ auVar72);
                auVar30 = vpmovsxwd_avx(auVar72);
                auVar72 = vpunpckhwd_avx(auVar72,auVar72);
                auVar110._16_16_ = auVar72;
                auVar110._0_16_ = auVar30;
                auVar11 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                   (local_a8._0_8_ + uVar14 * 4));
                auVar110 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                    ((long)pvVar16 + uVar14 * 4));
                auVar35._0_4_ = auVar11._0_4_ * auVar110._0_4_ + auVar38._0_4_;
                auVar35._4_4_ = auVar11._4_4_ * auVar110._4_4_ + auVar38._4_4_;
                auVar35._8_4_ = auVar11._8_4_ * auVar110._8_4_ + auVar38._8_4_;
                auVar35._12_4_ = auVar11._12_4_ * auVar110._12_4_ + auVar38._12_4_;
                auVar37._16_4_ = auVar11._16_4_ * auVar110._16_4_ + auVar38._16_4_;
                auVar37._0_16_ = auVar35;
                auVar37._20_4_ = auVar11._20_4_ * auVar110._20_4_ + auVar38._20_4_;
                auVar37._24_4_ = auVar11._24_4_ * auVar110._24_4_ + auVar38._24_4_;
                auVar37._28_4_ = auVar110._28_4_ + auVar38._28_4_;
                uVar14 = uVar14 + 8;
                auVar81 = ZEXT3264(auVar37);
              } while ((_h + 7 & 0xfffffff8) != uVar14);
              auVar109._0_8_ = uVar12 ^ 0x8000000000000000;
              auVar109._8_4_ = uVar114;
              auVar109._12_4_ = uVar17 ^ 0x80000000;
              auVar79._0_8_ = auVar64._0_8_ ^ 0x8000000000000000;
              auVar79._12_4_ = auVar64._12_4_ ^ 0x80000000;
              auVar72 = vpcmpgtq_avx(auVar79,auVar109);
              auVar30 = vpackssdw_avx(auVar72,auVar50);
              auVar94._0_8_ = uVar12 ^ 0x8000000000000000;
              auVar94._8_4_ = uVar114;
              auVar94._12_4_ = uVar17 ^ 0x80000000;
              auVar53._0_8_ = auVar10._0_8_ ^ 0x8000000000000000;
              auVar53._12_4_ = auVar10._12_4_ ^ 0x80000000;
              auVar72 = vpcmpgtq_avx(auVar53,auVar94);
              auVar72 = vpackssdw_avx(auVar72,auVar32);
              auVar72 = vblendvps_avx(auVar38._0_16_,auVar35,auVar84 ^ auVar72);
              auVar30 = vblendvps_avx(auVar38._16_16_,auVar37._16_16_,auVar84 ^ auVar30);
              auVar72 = vhaddps_avx(auVar30,auVar72);
              auVar72 = vhaddps_avx(auVar72,auVar72);
              auVar72 = vhaddps_avx(auVar72,auVar72);
              uVar114 = auVar72._0_4_;
            }
            *(undefined4 *)((long)pvVar26 + uVar27 * 4) = uVar114;
            *(undefined4 *)((long)pvVar8 + uVar27 * 4) = uVar114;
            uVar27 = uVar27 + 1;
            pvVar16 = (void *)((long)pvVar16 + (long)iVar22 * sVar9);
          } while (uVar27 != uVar7);
        }
        uVar17 = (int)local_c0 + 1;
        uVar27 = (ulong)uVar17;
      } while (uVar17 != uVar6);
    }
    iVar22 = 0;
  }
  else {
    Mat::create((Mat *)local_a8,_h,4,opt->workspace_allocator);
    iVar22 = -100;
    if (((void *)local_a8._0_8_ != (void *)0x0) && ((long)local_70 * local_68 != 0))
    goto LAB_0037c2f0;
  }
  piVar13 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_88 == (Allocator *)0x0) {
        if ((void *)local_a8._0_8_ != (void *)0x0) {
          free((void *)local_a8._0_8_);
        }
      }
      else {
        (*local_88->_vptr_Allocator[3])();
      }
    }
  }
LAB_0037cf06:
  piVar13 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar22;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, const Mat& weight_hr, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;
    int hidden_size = cell_state.w;

    // 4 x hidden_size
    Mat gates(4, hidden_size, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    Mat tmp_hidden_state;
    if (num_output != hidden_size)
    {
        tmp_hidden_state.create(hidden_size, 4u, opt.workspace_allocator);
        if (tmp_hidden_state.empty())
            return -100;
    }

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

#if __AVX__
        int nn_hidden_size = hidden_size >> 1;
        int remain_hidden_size_start = nn_hidden_size << 1;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int qq = 0; qq < nn_hidden_size; qq++)
        {
            int q = qq * 2;

            const float* bias_c_IFOG = (const float*)bias_c + q * 4;

            // gate I F O G
            const float* weight_xc_IFOG = weight_xc.row(q / 2);
            const float* weight_hc_IFOG = weight_hc.row(q / 2);

            __m256 _IFOG = _mm256_loadu_ps(bias_c_IFOG);
            __m256 _sum1 = _mm256_setzero_ps();
            __m256 _sum2 = _mm256_setzero_ps();
            __m256 _sum3 = _mm256_setzero_ps();

            const float* x = bottom_blob.row(ti);

            int i = 0;
            for (; i + 3 < size; i += 4)
            {
                __m256 _xi0 = _mm256_broadcast_ss(x);
                __m256 _xi1 = _mm256_broadcast_ss(x + 1);
                __m256 _xi2 = _mm256_broadcast_ss(x + 2);
                __m256 _xi3 = _mm256_broadcast_ss(x + 3);
                __m256 _weight_xc_IFOG0 = _mm256_loadu_ps(weight_xc_IFOG);
                __m256 _weight_xc_IFOG1 = _mm256_loadu_ps(weight_xc_IFOG + 8);
                __m256 _weight_xc_IFOG2 = _mm256_loadu_ps(weight_xc_IFOG + 16);
                __m256 _weight_xc_IFOG3 = _mm256_loadu_ps(weight_xc_IFOG + 24);
                _IFOG = _mm256_comp_fmadd_ps(_weight_xc_IFOG0, _xi0, _IFOG);
                _sum1 = _mm256_comp_fmadd_ps(_weight_xc_IFOG1, _xi1, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_weight_xc_IFOG2, _xi2, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_weight_xc_IFOG3, _xi3, _sum3);

                x += 4;
                weight_xc_IFOG += 32;
            }
            for (; i < size; i++)
            {
                __m256 _xi = _mm256_broadcast_ss(x);
                __m256 _weight_xc_IFOG = _mm256_loadu_ps(weight_xc_IFOG);
                _IFOG = _mm256_comp_fmadd_ps(_weight_xc_IFOG, _xi, _IFOG);

                x += 1;
                weight_xc_IFOG += 8;
            }

            const float* hidden_ptr = hidden_state;

            i = 0;
            for (; i + 3 < num_output; i += 4)
            {
                __m256 _h_cont0 = _mm256_broadcast_ss(hidden_ptr);
                __m256 _h_cont1 = _mm256_broadcast_ss(hidden_ptr + 1);
                __m256 _h_cont2 = _mm256_broadcast_ss(hidden_ptr + 2);
                __m256 _h_cont3 = _mm256_broadcast_ss(hidden_ptr + 3);
                __m256 _weight_hc_IFOG0 = _mm256_loadu_ps(weight_hc_IFOG);
                __m256 _weight_hc_IFOG1 = _mm256_loadu_ps(weight_hc_IFOG + 8);
                __m256 _weight_hc_IFOG2 = _mm256_loadu_ps(weight_hc_IFOG + 16);
                __m256 _weight_hc_IFOG3 = _mm256_loadu_ps(weight_hc_IFOG + 24);
                _IFOG = _mm256_comp_fmadd_ps(_weight_hc_IFOG0, _h_cont0, _IFOG);
                _sum1 = _mm256_comp_fmadd_ps(_weight_hc_IFOG1, _h_cont1, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_weight_hc_IFOG2, _h_cont2, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_weight_hc_IFOG3, _h_cont3, _sum3);

                hidden_ptr += 4;
                weight_hc_IFOG += 32;
            }
            for (; i < num_output; i++)
            {
                __m256 _h_cont = _mm256_broadcast_ss(hidden_ptr);
                __m256 _weight_hc_IFOG = _mm256_loadu_ps(weight_hc_IFOG);
                _IFOG = _mm256_comp_fmadd_ps(_weight_hc_IFOG, _h_cont, _IFOG);

                hidden_ptr += 1;
                weight_hc_IFOG += 8;
            }

            float* gates_data = gates.row(q);

            _IFOG = _mm256_add_ps(_IFOG, _sum1);
            _sum2 = _mm256_add_ps(_sum2, _sum3);
            _IFOG = _mm256_add_ps(_IFOG, _sum2);

            _mm256_storeu_ps(gates_data, _IFOG);
        }
#else
        int nn_hidden_size = 0;
        int remain_hidden_size_start = 0;
#endif // __AVX__

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = remain_hidden_size_start; q < hidden_size; q++)
        {
            const float* bias_c_IFOG = (const float*)bias_c + q * 4;

            // gate I F O G
#if __AVX__
            const float* weight_xc_IFOG = weight_xc.row(q / 2 + q % 2);
            const float* weight_hc_IFOG = weight_hc.row(q / 2 + q % 2);
#else
            const float* weight_xc_IFOG = weight_xc.row(q);
            const float* weight_hc_IFOG = weight_hc.row(q);
#endif

#if __SSE2__
            __m128 _IFOG = _mm_loadu_ps(bias_c_IFOG);
            __m128 _sum1 = _mm_setzero_ps();
            __m128 _sum2 = _mm_setzero_ps();
            __m128 _sum3 = _mm_setzero_ps();
#else  // __SSE2__
            float I = bias_c_IFOG[0];
            float F = bias_c_IFOG[1];
            float O = bias_c_IFOG[2];
            float G = bias_c_IFOG[3];
#endif // __SSE2__

            const float* x = bottom_blob.row(ti);

            int i = 0;
#if __SSE2__
            for (; i + 3 < size; i += 4)
            {
                __m128 _xi0 = _mm_load1_ps(x);
                __m128 _xi1 = _mm_load1_ps(x + 1);
                __m128 _xi2 = _mm_load1_ps(x + 2);
                __m128 _xi3 = _mm_load1_ps(x + 3);
                __m128 _weight_xc_IFOG0 = _mm_loadu_ps(weight_xc_IFOG);
                __m128 _weight_xc_IFOG1 = _mm_loadu_ps(weight_xc_IFOG + 4);
                __m128 _weight_xc_IFOG2 = _mm_loadu_ps(weight_xc_IFOG + 8);
                __m128 _weight_xc_IFOG3 = _mm_loadu_ps(weight_xc_IFOG + 12);
                _IFOG = _mm_comp_fmadd_ps(_weight_xc_IFOG0, _xi0, _IFOG);
                _sum1 = _mm_comp_fmadd_ps(_weight_xc_IFOG1, _xi1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_weight_xc_IFOG2, _xi2, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_weight_xc_IFOG3, _xi3, _sum3);

                x += 4;
                weight_xc_IFOG += 16;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
#if __SSE2__
                __m128 _xi = _mm_load1_ps(x);
                __m128 _weight_xc_IFOG = _mm_loadu_ps(weight_xc_IFOG);
                _IFOG = _mm_comp_fmadd_ps(_weight_xc_IFOG, _xi, _IFOG);
#else  // __SSE2__
                float xi = x[0];
                I += xi * weight_xc_IFOG[0];
                F += xi * weight_xc_IFOG[1];
                O += xi * weight_xc_IFOG[2];
                G += xi * weight_xc_IFOG[3];
#endif // __SSE2__

                x += 1;
                weight_xc_IFOG += 4;
            }

            const float* hidden_ptr = hidden_state;

            i = 0;
#if __SSE2__
            for (; i + 3 < num_output; i += 4)
            {
                __m128 _h_cont0 = _mm_load1_ps(hidden_ptr);
                __m128 _h_cont1 = _mm_load1_ps(hidden_ptr + 1);
                __m128 _h_cont2 = _mm_load1_ps(hidden_ptr + 2);
                __m128 _h_cont3 = _mm_load1_ps(hidden_ptr + 3);
                __m128 _weight_hc_IFOG0 = _mm_loadu_ps(weight_hc_IFOG);
                __m128 _weight_hc_IFOG1 = _mm_loadu_ps(weight_hc_IFOG + 4);
                __m128 _weight_hc_IFOG2 = _mm_loadu_ps(weight_hc_IFOG + 8);
                __m128 _weight_hc_IFOG3 = _mm_loadu_ps(weight_hc_IFOG + 12);
                _IFOG = _mm_comp_fmadd_ps(_weight_hc_IFOG0, _h_cont0, _IFOG);
                _sum1 = _mm_comp_fmadd_ps(_weight_hc_IFOG1, _h_cont1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_weight_hc_IFOG2, _h_cont2, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_weight_hc_IFOG3, _h_cont3, _sum3);

                hidden_ptr += 4;
                weight_hc_IFOG += 16;
            }
#endif // __SSE2__
            for (; i < num_output; i++)
            {
#if __SSE2__
                __m128 _h_cont = _mm_load1_ps(hidden_ptr);
                __m128 _weight_hc_IFOG = _mm_loadu_ps(weight_hc_IFOG);
                _IFOG = _mm_comp_fmadd_ps(_weight_hc_IFOG, _h_cont, _IFOG);
#else  // __SSE2__
                float h_cont = hidden_ptr[0];
                I += h_cont * weight_hc_IFOG[0];
                F += h_cont * weight_hc_IFOG[1];
                O += h_cont * weight_hc_IFOG[2];
                G += h_cont * weight_hc_IFOG[3];
#endif // __SSE2__

                hidden_ptr += 1;
                weight_hc_IFOG += 4;
            }

            float* gates_data = gates.row(q);

#if __SSE2__
            _IFOG = _mm_add_ps(_IFOG, _sum1);
            _sum2 = _mm_add_ps(_sum2, _sum3);
            _IFOG = _mm_add_ps(_IFOG, _sum2);

            _mm_storeu_ps(gates_data, _IFOG);
#else  // __SSE2__
            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
#endif // __SSE2__
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);

        float* cell_ptr = cell_state;
        float* hidden_ptr = hidden_state;
        float* tmp_hidden_ptr = tmp_hidden_state;

#if __SSE2__
        nn_hidden_size = hidden_size >> 2;
        remain_hidden_size_start = nn_hidden_size << 2;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int qq = 0; qq < nn_hidden_size; qq++)
        {
            int q = qq * 4;

            const float* gates_data = gates.row(q);

            __m128 _IFOG_4x4_0 = _mm_loadu_ps(gates_data);
            __m128 _IFOG_4x4_1 = _mm_loadu_ps(gates_data + 4);
            __m128 _IFOG_4x4_2 = _mm_loadu_ps(gates_data + 8);
            __m128 _IFOG_4x4_3 = _mm_loadu_ps(gates_data + 12);

            _MM_TRANSPOSE4_PS(_IFOG_4x4_0, _IFOG_4x4_1, _IFOG_4x4_2, _IFOG_4x4_3);

            __m128 _lstm_I = sigmoid_sse(_IFOG_4x4_0);
            __m128 _lstm_F = sigmoid_sse(_IFOG_4x4_1);
            __m128 _lstm_O = sigmoid_sse(_IFOG_4x4_2);
            __m128 _lstm_G = tanh_sse(_IFOG_4x4_3);

            __m128 _cell2 = _mm_add_ps(_mm_mul_ps(_lstm_F, _mm_loadu_ps(cell_ptr + q)), _mm_mul_ps(_lstm_I, _lstm_G));
            __m128 _lstm_H = _mm_mul_ps(_lstm_O, tanh_sse(_cell2));

            _mm_storeu_ps(cell_ptr + q, _cell2);

            if (num_output == hidden_size)
            {
                _mm_storeu_ps(hidden_ptr + q, _lstm_H);
                _mm_storeu_ps(output_data + q, _lstm_H);
            }
            else
            {
                _mm_storeu_ps(tmp_hidden_ptr + q, _lstm_H);
            }
        }
#else  // __SSE2__
        remain_hidden_size_start = 0;
#endif // __SSE2__
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = remain_hidden_size_start; q < hidden_size; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + expf(-I));
            F = 1.f / (1.f + expf(-F));
            O = 1.f / (1.f + expf(-O));
            G = tanhf(G);

            float cell2 = F * cell_ptr[q] + I * G;
            float H = O * tanhf(cell2);

            cell_ptr[q] = cell2;
            if (num_output == hidden_size)
            {
                hidden_ptr[q] = H;
                output_data[q] = H;
            }
            else
            {
                tmp_hidden_ptr[q] = H;
            }
        }

        if (num_output != hidden_size)
        {
            // int nn_num_output = num_output >> 2;
            // int remain_num_output_start = nn_num_output << 2;
            // #pragma omp parallel for num_threads(opt.num_threads)
            // for (int qq = 0; qq < nn_num_output; qq++)
            // {
            //     int q = qq * 4;
            //
            // }
            int remain_num_output_start = 0;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = remain_num_output_start; q < num_output; q++)
            {
                const float* hr = weight_hr.row(q);
                const float* tmp_hidden_ptr = tmp_hidden_state;

                float H = 0;
                for (int i = 0; i < hidden_size; i++)
                {
                    H += tmp_hidden_ptr[i] * hr[i];
                }

                output_data[q] = H;
                hidden_ptr[q] = H;
            }
        }
    }

    return 0;
}